

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::ThreadContextTTD::AddNewScriptContextReplay
          (ThreadContextTTD *this,FinalizableObject *externalCtx,ScriptContext *ctx,
          HostScriptContextCallbackFunctor *callbackFunctor,bool noNative,bool debugMode)

{
  Recycler *this_00;
  bool debugMode_local;
  bool noNative_local;
  HostScriptContextCallbackFunctor *callbackFunctor_local;
  ScriptContext *ctx_local;
  FinalizableObject *externalCtx_local;
  ThreadContextTTD *this_local;
  
  callbackFunctor_local = (HostScriptContextCallbackFunctor *)ctx;
  ctx_local = (ScriptContext *)externalCtx;
  externalCtx_local = (FinalizableObject *)this;
  AddNewScriptContext_Helper(this,ctx,callbackFunctor,noNative,debugMode);
  this->m_contextCreatedOrDestoyedInReplay = true;
  this_00 = ThreadContext::GetRecycler(this->m_threadCtx);
  Memory::Recycler::RootAddRef(this_00,ctx_local,(uint *)0x0);
  JsUtil::
  BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Add(&this->m_ttdContextToExternalRefMap,(ScriptContext **)&callbackFunctor_local,
        (FinalizableObject **)&ctx_local);
  return;
}

Assistant:

void ThreadContextTTD::AddNewScriptContextReplay(FinalizableObject* externalCtx, Js::ScriptContext* ctx, HostScriptContextCallbackFunctor& callbackFunctor, bool noNative, bool debugMode)
    {
        this->AddNewScriptContext_Helper(ctx, callbackFunctor, noNative, debugMode);

        this->m_contextCreatedOrDestoyedInReplay = true;

        this->m_threadCtx->GetRecycler()->RootAddRef(externalCtx);
        this->m_ttdContextToExternalRefMap.Add(ctx, externalCtx);
    }